

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O3

Fx_Man_t * Fx_ManStart(Vec_Wec_t *vCubes)

{
  Fx_Man_t *pFVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  
  pFVar1 = (Fx_Man_t *)calloc(1,0xa0);
  pFVar1->vCubes = vCubes;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  piVar3 = (int *)malloc(400);
  pVVar2->pArray = piVar3;
  pFVar1->vCubesS = pVVar2;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  piVar3 = (int *)malloc(400);
  pVVar2->pArray = piVar3;
  pFVar1->vCubesD = pVVar2;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  piVar3 = (int *)malloc(400);
  pVVar2->pArray = piVar3;
  pFVar1->vCompls = pVVar2;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  piVar3 = (int *)malloc(400);
  pVVar2->pArray = piVar3;
  pFVar1->vCubeFree = pVVar2;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  piVar3 = (int *)malloc(400);
  pVVar2->pArray = piVar3;
  pFVar1->vDiv = pVVar2;
  return pFVar1;
}

Assistant:

Fx_Man_t * Fx_ManStart( Vec_Wec_t * vCubes )
{
    Fx_Man_t * p;
    p = ABC_CALLOC( Fx_Man_t, 1 );
    p->vCubes   = vCubes;
    // temporary data
    p->vCubesS   = Vec_IntAlloc( 100 );
    p->vCubesD   = Vec_IntAlloc( 100 );
    p->vCompls   = Vec_IntAlloc( 100 );
    p->vCubeFree = Vec_IntAlloc( 100 );
    p->vDiv      = Vec_IntAlloc( 100 );
    return p;
}